

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O2

htmlEntityDesc * htmlParseEntityRef(htmlParserCtxtPtr ctxt,xmlChar **str)

{
  xmlChar *name;
  htmlEntityDesc *phVar1;
  xmlParserInputPtr in;
  
  if (str != (xmlChar **)0x0) {
    *str = (xmlChar *)0x0;
  }
  if (((ctxt != (htmlParserCtxtPtr)0x0) && (ctxt->input != (xmlParserInputPtr)0x0)) &&
     (*ctxt->input->cur == '&')) {
    xmlNextChar(ctxt);
    name = htmlParseName(ctxt);
    if (name == (xmlChar *)0x0) {
      htmlParseErr(ctxt,XML_ERR_NAME_REQUIRED,"htmlParseEntityRef: no name\n",(xmlChar *)0x0,
                   (xmlChar *)0x0);
      return (htmlEntityDesc *)0x0;
    }
    in = ctxt->input;
    if ((ctxt->progressive == 0) && ((long)in->end - (long)in->cur < 0xfa)) {
      xmlParserInputGrow(in,0xfa);
      in = ctxt->input;
    }
    if (*in->cur == ';') {
      if (str != (xmlChar **)0x0) {
        *str = name;
      }
      phVar1 = htmlEntityLookup(name);
      if (phVar1 != (htmlEntityDesc *)0x0) {
        xmlNextChar(ctxt);
        return phVar1;
      }
    }
    else {
      htmlParseErr(ctxt,XML_ERR_ENTITYREF_SEMICOL_MISSING,"htmlParseEntityRef: expecting \';\'\n",
                   (xmlChar *)0x0,(xmlChar *)0x0);
      if (str == (xmlChar **)0x0) {
        return (htmlEntityDesc *)0x0;
      }
      *str = name;
    }
  }
  return (htmlEntityDesc *)0x0;
}

Assistant:

const htmlEntityDesc *
htmlParseEntityRef(htmlParserCtxtPtr ctxt, const xmlChar **str) {
    const xmlChar *name;
    const htmlEntityDesc * ent = NULL;

    if (str != NULL) *str = NULL;
    if ((ctxt == NULL) || (ctxt->input == NULL)) return(NULL);

    if (CUR == '&') {
        NEXT;
        name = htmlParseName(ctxt);
	if (name == NULL) {
	    htmlParseErr(ctxt, XML_ERR_NAME_REQUIRED,
	                 "htmlParseEntityRef: no name\n", NULL, NULL);
	} else {
	    GROW;
	    if (CUR == ';') {
	        if (str != NULL)
		    *str = name;

		/*
		 * Lookup the entity in the table.
		 */
		ent = htmlEntityLookup(name);
		if (ent != NULL) /* OK that's ugly !!! */
		    NEXT;
	    } else {
		htmlParseErr(ctxt, XML_ERR_ENTITYREF_SEMICOL_MISSING,
		             "htmlParseEntityRef: expecting ';'\n",
			     NULL, NULL);
	        if (str != NULL)
		    *str = name;
	    }
	}
    }
    return(ent);
}